

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  StyledWriter *this_local;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__StyledWriter_001ae660;
  std::__cxx11::string::~string((string *)&this->indentString_);
  std::__cxx11::string::~string((string *)&this->document_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->childValues_);
  Writer::~Writer(&this->super_Writer);
  return;
}

Assistant:

~StyledWriter() override = default;